

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::BuildReg1Uint16x8_1
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot)

{
  code *pcVar1;
  bool bVar2;
  StackSym *sym;
  undefined4 *puVar3;
  SymOpnd *this_00;
  StackSym *symDst;
  Opnd *dstOpnd;
  Instr *instr;
  RegOpnd *local_28;
  RegOpnd *srcOpnd;
  RegSlot src1RegSlot_local;
  RegSlot dstRegSlot_local;
  uint32 offset_local;
  OpCodeAsmJs newOpcode_local;
  IRBuilderAsmJs *this_local;
  
  srcOpnd._0_4_ = src1RegSlot;
  srcOpnd._4_4_ = dstRegSlot;
  src1RegSlot_local = offset;
  dstRegSlot_local._2_2_ = newOpcode;
  _offset_local = this;
  local_28 = BuildSrcOpnd(this,src1RegSlot,TySimd128U8);
  instr._6_2_ = ValueType::Simd.field_0;
  IR::Opnd::SetValueType(&local_28->super_Opnd,ValueType::Simd);
  dstOpnd = (Opnd *)0x0;
  if (dstRegSlot_local._2_2_ == Simd128_I_ArgOut_U8) {
    sym = StackSym::NewArgSlotSym((ArgSlot)srcOpnd._4_4_,this->m_func,TySimd128U8);
    *(uint *)&sym->field_0x18 = *(uint *)&sym->field_0x18 & 0xffffefff | 0x1000;
    if ((sym == (StackSym *)0x0) || ((srcOpnd._4_4_ & 0xffff) != srcOpnd._4_4_)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x15dd,"((0))","Arg count too big...");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
    this_00 = IR::SymOpnd::New(&sym->super_Sym,TySimd128U4,this->m_func);
    IR::Opnd::SetValueType(&this_00->super_Opnd,ValueType::Simd);
    dstOpnd = (Opnd *)IR::Instr::New(ArgOut_A,&this_00->super_Opnd,&local_28->super_Opnd,
                                     this->m_func);
    AddInstr(this,(Instr *)dstOpnd,src1RegSlot_local);
    SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Push
              (&this->m_argStack->super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>,
               (Instr **)&dstOpnd);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x15eb,"((0))","UNREACHED");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void IRBuilderAsmJs::BuildReg1Uint16x8_1(Js::OpCodeAsmJs newOpcode, uint32 offset, BUILD_SIMD_ARGS_REG2)
{
    IR::RegOpnd * srcOpnd = BuildSrcOpnd(src1RegSlot, TySimd128U8);
    srcOpnd->SetValueType(ValueType::Simd);

    IR::Instr * instr = nullptr;
    IR::Opnd * dstOpnd = nullptr;
    StackSym * symDst = nullptr;

    if (newOpcode == Js::OpCodeAsmJs::Simd128_I_ArgOut_U8)
    {
        symDst = StackSym::NewArgSlotSym((uint16)dstRegSlot, m_func, TySimd128U8);
        symDst->m_allocated = true;
        if (symDst == nullptr || (uint16)(dstRegSlot) != (dstRegSlot))
        {
            AssertMsg(UNREACHED, "Arg count too big...");
            Fatal();
        }

        dstOpnd = IR::SymOpnd::New(symDst, TySimd128U4, m_func);
        dstOpnd->SetValueType(ValueType::Simd);

        instr = IR::Instr::New(Js::OpCode::ArgOut_A, dstOpnd, srcOpnd, m_func);
        AddInstr(instr, offset);

        m_argStack->Push(instr);
    }
    else
    {
        Assert(UNREACHED);
    }
}